

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

ExtPubkey *
cfd::core::ConfidentialTransaction::GenerateExtPubkeyFromDescriptor
          (ExtPubkey *__return_storage_ptr__,string *bitcoin_descriptor,uint32_t bip32_counter,
          ByteData *prefix,NetType net_type,NetType elements_net_type,ExtPubkey *base_ext_pubkey,
          Address *descriptor_derive_address)

{
  uint uVar1;
  bool bVar2;
  __type _Var3;
  NetType NVar4;
  Bip32FormatType BVar5;
  AddressType AVar6;
  CfdException *pCVar7;
  string xpub_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fe8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list_base;
  string desc_str;
  DescriptorScriptReference local_f68;
  DescriptorScriptReference derive_script;
  DescriptorScriptReference script_ref;
  ExtPubkey xpub;
  Descriptor desc;
  DescriptorKeyReference key_ref;
  
  if (kRegtest < net_type) {
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&script_ref,"Illegal bitcoin network type error.",
               (allocator *)&derive_script);
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&script_ref);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (elements_net_type < kLiquidV1) {
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&script_ref,"Illegal elements network type error.",
               (allocator *)&derive_script);
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&script_ref);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  uVar1 = *(uint *)(&DAT_005e5df8 + (ulong)net_type * 4);
  ExtPubkey::ExtPubkey(__return_storage_ptr__);
  ExtPubkey::ExtPubkey(&xpub);
  ::std::__cxx11::string::string((string *)&desc_str,(string *)bitcoin_descriptor);
  ExtPubkey::ExtPubkey((ExtPubkey *)&script_ref,bitcoin_descriptor);
  NVar4 = Extkey::GetNetworkType((Extkey *)&script_ref);
  bVar2 = ByteData::IsEmpty(prefix);
  if (bVar2) {
LAB_003dbb85:
    if (uVar1 != (NVar4 == kMainnet)) goto LAB_003dbc76;
    BVar5 = Extkey::GetFormatType((Extkey *)&script_ref);
    if (BVar5 == kBip84) {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f68,"wpkh(",bitcoin_descriptor);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &derive_script,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f68,")");
    }
    else if (BVar5 == kBip49) {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f68,"sh(wpkh(",bitcoin_descriptor);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &derive_script,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f68,"))");
    }
    else {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f68,"pkh(",bitcoin_descriptor);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &derive_script,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f68,")");
    }
  }
  else {
    Extkey::GetVersionData((ByteData *)&derive_script,(Extkey *)&script_ref);
    bVar2 = ByteData::Equals((ByteData *)&derive_script,prefix);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&derive_script);
    if (!bVar2) goto LAB_003dbb85;
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f68
                     ,"pkh(",bitcoin_descriptor);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &derive_script,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f68
                     ,")");
  }
  ::std::__cxx11::string::operator=((string *)&desc_str,(string *)&derive_script);
  ::std::__cxx11::string::~string((string *)&derive_script);
  ::std::__cxx11::string::~string((string *)&local_f68);
LAB_003dbc76:
  Extkey::~Extkey((Extkey *)&script_ref);
  arg_list_base.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arg_list_base.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arg_list_base.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::__cxx11::string::string((string *)&script_ref,"base",(allocator *)&derive_script);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arg_list_base,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&script_ref);
  ::std::__cxx11::string::~string((string *)&script_ref);
  arg_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arg_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arg_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::__cxx11::to_string((string *)&script_ref,bip32_counter);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arg_list,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&script_ref);
  ::std::__cxx11::string::~string((string *)&script_ref);
  Descriptor::Parse(&desc,&desc_str,
                    (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     *)0x0,kMainnet);
  Descriptor::GetReference(&script_ref,&desc,&arg_list_base);
  AVar6 = DescriptorScriptReference::GetAddressType(&script_ref);
  if ((kP2shP2wpkhAddress < AVar6) || ((0x54U >> (AVar6 & 0x1f) & 1) == 0)) {
    derive_script._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
         + 0x67;
    derive_script.locking_script_._vptr_Script._0_4_ = 0xdd2;
    derive_script.locking_script_.script_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "GenerateExtPubkeyFromDescriptor";
    logger::warn<>((CfdSourceLocation *)&derive_script,"bitcoin_descriptor invalid type.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&derive_script,
               "bitcoin_descriptor is not of any type supported: pkh(<xpub>), sh(wpkh(<xpub>)), wpkh(<xpub>), or <xpub>."
               ,(allocator *)&local_f68);
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&derive_script);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  AVar6 = DescriptorScriptReference::GetAddressType(&script_ref);
  if (AVar6 == kP2shP2wpkhAddress) {
    DescriptorScriptReference::GetChild(&derive_script,&script_ref);
    DescriptorScriptReference::operator=(&script_ref,&derive_script);
    DescriptorScriptReference::~DescriptorScriptReference(&derive_script);
  }
  DescriptorScriptReference::GetKeyList
            ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              *)&derive_script,&script_ref);
  DescriptorKeyReference::DescriptorKeyReference
            (&key_ref,(DescriptorKeyReference *)derive_script._0_8_);
  ::std::
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
  ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
           *)&derive_script);
  bVar2 = DescriptorKeyReference::HasExtPubkey(&key_ref);
  if (bVar2) {
    DescriptorKeyReference::GetExtPubkey((ExtPubkey *)&derive_script,&key_ref);
    Extkey::operator=(&base_ext_pubkey->super_Extkey,(Extkey *)&derive_script);
    Extkey::~Extkey((Extkey *)&derive_script);
    bVar2 = ByteData::IsEmpty(prefix);
    if (!bVar2) {
      Extkey::GetVersionData((ByteData *)&derive_script,&base_ext_pubkey->super_Extkey);
      bVar2 = ByteData::Equals((ByteData *)&derive_script,prefix);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&derive_script);
      if (!bVar2) {
        local_f68._0_8_ = "cfdcore_elements_transaction.cpp";
        local_f68.locking_script_._vptr_Script._0_4_ = 0xde5;
        local_f68.locking_script_.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = "GenerateExtPubkeyFromDescriptor";
        Extkey::GetVersionData((ByteData *)&xpub_str,&xpub.super_Extkey);
        ByteData::GetHex_abi_cxx11_((string *)&derive_script,(ByteData *)&xpub_str);
        logger::warn<std::__cxx11::string>
                  ((CfdSourceLocation *)&local_f68,"bitcoin_descriptor illegal prefix[{}].",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &derive_script);
        ::std::__cxx11::string::~string((string *)&derive_script);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&xpub_str);
        pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&derive_script,"bitcoin_descriptor illegal prefix.",
                   (allocator *)&local_f68);
        CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&derive_script);
        __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    DescriptorScriptReference::DescriptorScriptReference(&derive_script);
    Descriptor::GetReference(&local_f68,&desc,&arg_list);
    DescriptorScriptReference::operator=(&derive_script,&local_f68);
    DescriptorScriptReference::~DescriptorScriptReference(&local_f68);
    DescriptorScriptReference::operator=(&script_ref,&derive_script);
    AVar6 = DescriptorScriptReference::GetAddressType(&script_ref);
    if (AVar6 == kP2shP2wpkhAddress) {
      DescriptorScriptReference::GetChild(&local_f68,&script_ref);
      DescriptorScriptReference::operator=(&script_ref,&local_f68);
      DescriptorScriptReference::~DescriptorScriptReference(&local_f68);
    }
    DescriptorScriptReference::GetKeyList
              ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                *)&local_f68,&script_ref);
    DescriptorKeyReference::operator=(&key_ref,(DescriptorKeyReference *)local_f68._0_8_);
    ::std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)&local_f68);
    DescriptorKeyReference::GetExtPubkey((ExtPubkey *)&local_f68,&key_ref);
    Extkey::operator=(&__return_storage_ptr__->super_Extkey,(Extkey *)&local_f68);
    Extkey::~Extkey((Extkey *)&local_f68);
    Extkey::ToString_abi_cxx11_((string *)&local_f68,&__return_storage_ptr__->super_Extkey);
    Extkey::ToString_abi_cxx11_(&xpub_str,&base_ext_pubkey->super_Extkey);
    _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_f68,&xpub_str);
    ::std::__cxx11::string::~string((string *)&xpub_str);
    ::std::__cxx11::string::~string((string *)&local_f68);
    if (_Var3) {
      Extkey::ToString_abi_cxx11_((string *)&local_f68,&base_ext_pubkey->super_Extkey);
      ::std::operator+(&xpub_str,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f68,"/0/*");
      ::std::__cxx11::string::~string((string *)&local_f68);
      AVar6 = DescriptorScriptReference::GetAddressType(&derive_script);
      if (AVar6 == kP2shP2wpkhAddress) {
        ::std::operator+(&local_fe8,"sh(wpkh(",&xpub_str);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_f68,&local_fe8,"))");
      }
      else {
        AVar6 = DescriptorScriptReference::GetAddressType(&derive_script);
        if (AVar6 == kP2wpkhAddress) {
          ::std::operator+(&local_fe8,"wpkh(",&xpub_str);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_f68,&local_fe8,")");
        }
        else {
          ::std::operator+(&local_fe8,"pkh(",&xpub_str);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_f68,&local_fe8,")");
        }
      }
      ::std::__cxx11::string::operator=((string *)&xpub_str,(string *)&local_f68);
      ::std::__cxx11::string::~string((string *)&local_f68);
      ::std::__cxx11::string::~string((string *)&local_fe8);
      Descriptor::Parse((Descriptor *)&local_f68,&xpub_str,
                        (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                         *)0x0,kMainnet);
      Descriptor::operator=(&desc,(Descriptor *)&local_f68);
      DescriptorNode::~DescriptorNode((DescriptorNode *)&local_f68);
      Descriptor::GetReference(&local_f68,&desc,&arg_list);
      DescriptorScriptReference::operator=(&derive_script,&local_f68);
      DescriptorScriptReference::~DescriptorScriptReference(&local_f68);
      DescriptorScriptReference::operator=(&script_ref,&derive_script);
      AVar6 = DescriptorScriptReference::GetAddressType(&script_ref);
      if (AVar6 == kP2shP2wpkhAddress) {
        DescriptorScriptReference::GetChild(&local_f68,&script_ref);
        DescriptorScriptReference::operator=(&script_ref,&local_f68);
        DescriptorScriptReference::~DescriptorScriptReference(&local_f68);
      }
      DescriptorScriptReference::GetKeyList
                ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                  *)&local_f68,&script_ref);
      DescriptorKeyReference::operator=(&key_ref,(DescriptorKeyReference *)local_f68._0_8_);
      ::std::
      vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                 *)&local_f68);
      DescriptorKeyReference::GetExtPubkey((ExtPubkey *)&local_f68,&key_ref);
      Extkey::operator=(&__return_storage_ptr__->super_Extkey,(Extkey *)&local_f68);
      Extkey::~Extkey((Extkey *)&local_f68);
      ::std::__cxx11::string::~string((string *)&xpub_str);
    }
    if (descriptor_derive_address != (Address *)0x0) {
      DescriptorScriptReference::GenerateAddress((Address *)&local_f68,&derive_script,net_type);
      core::Address::operator=(descriptor_derive_address,(Address *)&local_f68);
      core::Address::~Address((Address *)&local_f68);
    }
    DescriptorScriptReference::~DescriptorScriptReference(&derive_script);
    DescriptorKeyReference::~DescriptorKeyReference(&key_ref);
    DescriptorScriptReference::~DescriptorScriptReference(&script_ref);
    DescriptorNode::~DescriptorNode(&desc.root_node_);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&arg_list);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&arg_list_base);
    ::std::__cxx11::string::~string((string *)&desc_str);
    Extkey::~Extkey(&xpub.super_Extkey);
    return __return_storage_ptr__;
  }
  derive_script._0_8_ =
       (long)
       "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
       + 0x67;
  derive_script.locking_script_._vptr_Script._0_4_ = 0xdde;
  derive_script.locking_script_.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = "GenerateExtPubkeyFromDescriptor";
  logger::warn<>((CfdSourceLocation *)&derive_script,"bitcoin_descriptor invalid extkey format.");
  pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&derive_script,"BitcoinDescriptor invalid extkey format.",
             (allocator *)&local_f68);
  CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&derive_script);
  __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPubkey ConfidentialTransaction::GenerateExtPubkeyFromDescriptor(
    const std::string &bitcoin_descriptor, uint32_t bip32_counter,
    const ByteData &prefix, NetType net_type, NetType elements_net_type,
    ExtPubkey *base_ext_pubkey, Address *descriptor_derive_address) {
  bool is_mainnet = false;
  switch (net_type) {
    case NetType::kMainnet:
      is_mainnet = true;
      break;
    case NetType::kTestnet:
      // fall-through
    case NetType::kRegtest:
      break;
    default:
      throw CfdException(
          kCfdIllegalArgumentError, "Illegal bitcoin network type error.");
  }
  switch (elements_net_type) {
    case NetType::kMainnet:
    case NetType::kTestnet:
    case NetType::kRegtest:
      throw CfdException(
          kCfdIllegalArgumentError, "Illegal elements network type error.");
    case NetType::kLiquidV1:
    case NetType::kElementsRegtest:
    case NetType::kCustomChain:
    default:
      break;
  }

  ExtPubkey child_xpub;
  ExtPubkey xpub;
  std::string desc_str = bitcoin_descriptor;
  try {
    // check extkey (not output descriptor)
    ExtPubkey check_key(bitcoin_descriptor);
    bool is_mainnet_key = check_key.GetNetworkType() == kMainnet;
    if ((!prefix.IsEmpty()) && check_key.GetVersionData().Equals(prefix)) {
      desc_str = "pkh(" + bitcoin_descriptor + ")";  // create pkh descriptor
    } else if (is_mainnet == is_mainnet_key) {
      switch (check_key.GetFormatType()) {
        case kBip49:
          desc_str = "sh(wpkh(" + bitcoin_descriptor + "))";
          break;
        case kBip84:
          desc_str = "wpkh(" + bitcoin_descriptor + ")";
          break;
        default:
          desc_str = "pkh(" + bitcoin_descriptor + ")";
      }
    }
  } catch (const CfdException &except) {
    info(
        CFD_LOG_SOURCE, "bitcoin_descriptor check fail. go on next check.({})",
        except.what());
    // other descriptor
  }

  std::vector<std::string> arg_list_base;
  arg_list_base.push_back(std::string(kArgumentBaseExtkey));
  std::vector<std::string> arg_list;
  arg_list.push_back(std::to_string(bip32_counter));
  Descriptor desc = Descriptor::Parse(desc_str);
  DescriptorScriptReference script_ref = desc.GetReference(&arg_list_base);
  switch (script_ref.GetAddressType()) {
    case AddressType::kP2pkhAddress:
      // fall-through
    case AddressType::kP2wpkhAddress:
      // fall-through
    case AddressType::kP2shP2wpkhAddress:
      break;
    default:
      warn(CFD_LOG_SOURCE, "bitcoin_descriptor invalid type.");
      throw CfdException(
          kCfdIllegalArgumentError,
          "bitcoin_descriptor is not of any type supported: pkh(<xpub>), "
          "sh(wpkh(<xpub>)), wpkh(<xpub>), or <xpub>.");
  }

  if (script_ref.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
    script_ref = script_ref.GetChild();
  }
  DescriptorKeyReference key_ref = script_ref.GetKeyList()[0];
  if (!key_ref.HasExtPubkey()) {
    warn(CFD_LOG_SOURCE, "bitcoin_descriptor invalid extkey format.");
    throw CfdException(
        kCfdIllegalArgumentError, "BitcoinDescriptor invalid extkey format.");
  }
  *base_ext_pubkey = key_ref.GetExtPubkey();
  if (!prefix.IsEmpty() && !base_ext_pubkey->GetVersionData().Equals(prefix)) {
    warn(
        CFD_LOG_SOURCE, "bitcoin_descriptor illegal prefix[{}].",
        xpub.GetVersionData().GetHex());
    throw CfdException(
        kCfdIllegalArgumentError, "bitcoin_descriptor illegal prefix.");
  }

  // collect derive key
  DescriptorScriptReference derive_script;
  derive_script = desc.GetReference(&arg_list);
  script_ref = derive_script;
  if (script_ref.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
    script_ref = script_ref.GetChild();
  }
  key_ref = script_ref.GetKeyList()[0];
  child_xpub = key_ref.GetExtPubkey();

  // If it is the same as base, add a default path.
  if (child_xpub.ToString() == base_ext_pubkey->ToString()) {
    std::string xpub_str = base_ext_pubkey->ToString() + "/0/*";
    if (derive_script.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
      xpub_str = "sh(wpkh(" + xpub_str + "))";
    } else if (derive_script.GetAddressType() == AddressType::kP2wpkhAddress) {
      xpub_str = "wpkh(" + xpub_str + ")";
    } else {
      xpub_str = "pkh(" + xpub_str + ")";
    }
    desc = Descriptor::Parse(xpub_str);
    derive_script = desc.GetReference(&arg_list);
    script_ref = derive_script;
    if (script_ref.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
      script_ref = script_ref.GetChild();
    }
    key_ref = script_ref.GetKeyList()[0];
    child_xpub = key_ref.GetExtPubkey();
  }

  if (descriptor_derive_address != nullptr) {
    *descriptor_derive_address = derive_script.GenerateAddress(net_type);
  }
  return child_xpub;
}